

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::skipAll(Nibbler *this,char c)

{
  size_type sVar1;
  size_type i;
  char c_local;
  Nibbler *this_local;
  
  if (this->_cursor < this->_length) {
    sVar1 = std::__cxx11::string::find_first_not_of((char)this,(ulong)(uint)(int)c);
    if (sVar1 == this->_cursor) {
      this_local._7_1_ = false;
    }
    else {
      if (sVar1 == 0xffffffffffffffff) {
        this->_cursor = this->_length;
      }
      else {
        this->_cursor = sVar1;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Nibbler::skipAll (char c)
{
  if (_cursor < _length)
  {
    std::string::size_type i = _input.find_first_not_of (c, _cursor);
    if (i == _cursor)
      return false;

    if (i == std::string::npos)
      _cursor = _length;  // Yes, off the end.
    else
      _cursor = i;

    return true;
  }

  return false;
}